

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLimit.cpp
# Opt level: O2

double __thiscall chrono::ChLinkLimit::GetForce(ChLinkLimit *this,double x,double x_dt)

{
  bool bVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double dVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar16;
  
  bVar1 = this->m_penalty_only;
  if ((double)((ulong)(bVar1 & 1) * -0x3e32329b00800000 +
              (ulong)!(bool)(bVar1 & 1) * (long)this->m_min) < x) {
    dVar16 = this->m_minCushion;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = dVar16;
    dVar5 = this->m_min + dVar16;
    if (x < dVar5) {
      dVar5 = dVar5 - x;
      uVar6 = vcmpsd_avx512f(auVar14,ZEXT816(0x3e7ad7f29abcaf48),9);
      bVar1 = (bool)((byte)uVar6 & 1);
      dVar2 = this->m_Kmin;
      auVar7._0_8_ = (ulong)bVar1 * 0x3ff0000000000000 + (ulong)!bVar1 * (long)(dVar5 / dVar16);
      auVar7._8_8_ = 0;
      auVar14 = vminsd_avx(ZEXT816(0x3ff0000000000000),auVar7);
      auVar10._0_8_ = auVar14._0_8_;
      dVar9 = auVar10._0_8_;
      (*((this->m_Kmin_modul).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->_vptr_ChFunction[4])();
      dVar16 = this->m_Rmin;
      auVar10._8_8_ = 0;
      (*((this->m_Rmin_modul).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->_vptr_ChFunction[4])();
      auVar12._8_8_ = 0;
      auVar12._0_8_ = x_dt * dVar16;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = dVar9 * dVar5 * dVar2;
      auVar14 = vfnmadd213sd_fma(auVar10,auVar12,auVar3);
      auVar14 = vmaxsd_avx(ZEXT816(0),auVar14);
      return auVar14._0_8_;
    }
  }
  dVar16 = 0.0;
  if (x < (double)((ulong)(bVar1 & 1) * 0x41cdcd64ff800000 +
                  (ulong)!(bool)(bVar1 & 1) * (long)this->m_max)) {
    dVar5 = this->m_maxCushion;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = dVar5;
    dVar2 = this->m_max - dVar5;
    if (dVar2 < x) {
      dVar2 = x - dVar2;
      uVar6 = vcmpsd_avx512f(auVar15,ZEXT816(0x3e7ad7f29abcaf48),9);
      bVar1 = (bool)((byte)uVar6 & 1);
      dVar16 = this->m_Kmax;
      auVar8._0_8_ = (ulong)bVar1 * 0x3ff0000000000000 + (ulong)!bVar1 * (long)(dVar2 / dVar5);
      auVar8._8_8_ = 0;
      auVar14 = vminsd_avx(ZEXT816(0x3ff0000000000000),auVar8);
      auVar11._0_8_ = auVar14._0_8_;
      dVar9 = auVar11._0_8_;
      (*((this->m_Kmax_modul).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->_vptr_ChFunction[4])();
      dVar5 = this->m_Rmax;
      auVar11._8_8_ = 0;
      (*((this->m_Rmax_modul).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->_vptr_ChFunction[4])();
      auVar13._8_8_ = 0;
      auVar13._0_8_ = x_dt * dVar5;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = dVar9 * dVar2 * dVar16;
      auVar14 = vfnmsub213sd_fma(auVar11,auVar13,auVar4);
      auVar14 = vminsd_avx(ZEXT816(0),auVar14);
      dVar16 = auVar14._0_8_;
    }
  }
  return dVar16;
}

Assistant:

double ChLinkLimit::GetForce(double x, double x_dt) const {
    double cush_coord;
    double cush_coord_norm;
    double force;
    double min_val, max_val;

    if (!m_penalty_only) {
        min_val = m_min;
        max_val = m_max;
    } else {
        min_val = -999999999;
        max_val = 999999999;
    }

    if (x > min_val && x < m_min + m_minCushion) {
        cush_coord = (m_min + m_minCushion) - x;

        if (m_minCushion >= 0.0000001)
            cush_coord_norm = cush_coord / m_minCushion;
        else
            cush_coord_norm = 1;

        if (cush_coord_norm > 1)
            cush_coord_norm = 1;  // clip cushion forces at stopper limit

        force = cush_coord * m_Kmin * m_Kmin_modul->Get_y(cush_coord_norm);
        force += (-x_dt) * m_Rmin * m_Rmin_modul->Get_y(cush_coord_norm);
        if (force < 0) {
            force = 0;
        }  // damping could cause neg force while going away,
           // so -as the limit is not "sticky"- clip force sign.

        return (force);
    }

    if (x < max_val && x > m_max - m_maxCushion) {
        cush_coord = x - (m_max - m_maxCushion);

        if (m_maxCushion >= 0.0000001)
            cush_coord_norm = cush_coord / m_maxCushion;
        else
            cush_coord_norm = 1;

        if (cush_coord_norm > 1)
            cush_coord_norm = 1;  // clip cushion forces at stopper limit

        force = (-cush_coord) * m_Kmax * m_Kmax_modul->Get_y(cush_coord_norm);
        force += (-x_dt) * m_Rmax * m_Rmax_modul->Get_y(cush_coord_norm);
        if (force > 0) {
            force = 0;
        }  // damping could cause pos force while going away,
           // so -as the limit is not "sticky"- clip force sign.
        return (force);
    }
    return 0;
}